

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

Ssw_RarMan_t * Ssw_RarManStart(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  int iVar1;
  Ssw_RarMan_t *pSVar2;
  int *piVar3;
  double *pdVar4;
  word *pwVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  Ssw_RarMan_t *p;
  Ssw_RarPars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  pSVar2 = (Ssw_RarMan_t *)calloc(1,0x70);
  pSVar2->pAig = pAig;
  pSVar2->pPars = pPars;
  iVar1 = Aig_ManRegNum(pAig);
  pSVar2->nGroups = iVar1 / pPars->nBinSize;
  piVar3 = (int *)calloc((long)((1 << ((byte)pPars->nBinSize & 0x1f)) * pSVar2->nGroups),4);
  pSVar2->pRarity = piVar3;
  pdVar4 = (double *)calloc((long)(pSVar2->pPars->nWords << 6),8);
  pSVar2->pPatCosts = pdVar4;
  iVar1 = Aig_ManRegNum(pAig);
  iVar1 = Ssw_RarBitWordNum(iVar1);
  pSVar2->nWordsReg = iVar1;
  iVar1 = Aig_ManObjNumMax(pAig);
  pwVar5 = (word *)malloc((long)(iVar1 * pSVar2->pPars->nWords) << 3);
  pSVar2->pObjData = pwVar5;
  pwVar5 = (word *)malloc((long)(pSVar2->pPars->nWords * 0x40 * pSVar2->nWordsReg) << 3);
  pSVar2->pPatData = pwVar5;
  pVVar6 = Vec_PtrAlloc(100);
  pSVar2->vUpdConst = pVVar6;
  pVVar6 = Vec_PtrAlloc(100);
  pSVar2->vUpdClass = pVVar6;
  pVVar7 = Vec_IntAlloc(100);
  pSVar2->vPatBests = pVVar7;
  return pSVar2;
}

Assistant:

static Ssw_RarMan_t * Ssw_RarManStart( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    Ssw_RarMan_t * p;
//    if ( Aig_ManRegNum(pAig) < nBinSize || nBinSize <= 0 )
//        return NULL;
    p = ABC_CALLOC( Ssw_RarMan_t, 1 );
    p->pAig      = pAig;
    p->pPars     = pPars;
    p->nGroups   = Aig_ManRegNum(pAig) / pPars->nBinSize;
    p->pRarity   = ABC_CALLOC( int, (1 << pPars->nBinSize) * p->nGroups );
    p->pPatCosts = ABC_CALLOC( double, p->pPars->nWords * 64 );
    p->nWordsReg = Ssw_RarBitWordNum( Aig_ManRegNum(pAig) );
    p->pObjData  = ABC_ALLOC( word, Aig_ManObjNumMax(pAig) * p->pPars->nWords );
    p->pPatData  = ABC_ALLOC( word, 64 * p->pPars->nWords * p->nWordsReg );
    p->vUpdConst = Vec_PtrAlloc( 100 );
    p->vUpdClass = Vec_PtrAlloc( 100 );
    p->vPatBests = Vec_IntAlloc( 100 );
    return p;
}